

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEPlanet.cpp
# Opt level: O1

bool __thiscall test_CEPlanet::test_jupiter(test_CEPlanet *this)

{
  double new_jd;
  undefined1 uVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  CEPlanet jupiter;
  allocator<double> local_292;
  allocator<double> local_291;
  CEAngle local_290;
  CEAngle local_280;
  CEAngle local_270;
  CEAngle local_260;
  CESkyCoordType local_250 [2];
  vector<double,_std::allocator<double>_> local_248;
  vector<double,_std::allocator<double>_> local_230;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  CESkyCoord local_1f8;
  CESkyCoord local_1c8;
  double local_198 [4];
  double local_178 [4];
  CEPlanet local_158;
  
  CEPlanet::Jupiter();
  new_jd = CEDate::JD(&this->base_date_);
  CEPlanet::UpdateCoordinates(&local_158,new_jd);
  local_200 = 34.382262940552884;
  CEAngle::Deg(&local_260,&local_200);
  local_208 = 12.515878086745667;
  CEAngle::Deg(&local_270,&local_208);
  local_250[1] = 1;
  CESkyCoord::CESkyCoord(&local_1c8,&local_260,&local_270,local_250 + 1);
  local_210 = 81.17000489188719;
  CEAngle::Deg(&local_280,&local_210);
  local_218 = 103.24919927509745;
  CEAngle::Deg(&local_290,&local_218);
  local_250[0] = OBSERVED;
  CESkyCoord::CESkyCoord(&local_1f8,&local_280,&local_290,local_250);
  local_178[0] = 3.99442023;
  local_178[1] = 2.7334608;
  local_178[2] = 1.07451899;
  std::allocator<double>::allocator(&local_291);
  __l._M_len = 3;
  __l._M_array = local_178;
  std::vector<double,_std::allocator<double>_>::vector(&local_230,__l,&local_291);
  local_198[0] = -0.00455544;
  local_198[1] = 0.00587705;
  local_198[2] = 0.00263009;
  std::allocator<double>::allocator(&local_292);
  __l_00._M_len = 3;
  __l_00._M_array = local_198;
  std::vector<double,_std::allocator<double>_>::vector(&local_248,__l_00,&local_292);
  (**(code **)(*(long *)this + 200))(this,&local_158,&local_1c8,&local_1f8,&local_230,&local_248);
  std::vector<double,_std::allocator<double>_>::~vector(&local_248);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_292);
  std::vector<double,_std::allocator<double>_>::~vector(&local_230);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_291);
  CESkyCoord::~CESkyCoord(&local_1f8);
  CEAngle::~CEAngle(&local_290);
  CEAngle::~CEAngle(&local_280);
  CESkyCoord::~CESkyCoord(&local_1c8);
  CEAngle::~CEAngle(&local_270);
  CEAngle::~CEAngle(&local_260);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEPlanet::~CEPlanet(&local_158);
  return (bool)uVar1;
}

Assistant:

bool test_CEPlanet::test_jupiter(void)
{
    // Create the planet object
    CEPlanet jupiter = CEPlanet::Jupiter();

    // Update the coordinates
    jupiter.UpdateCoordinates(base_date_.JD());

    // Run the actual test with values derived from AstroPy
    test_planet(jupiter,
                CESkyCoord(CEAngle::Deg(34.3822629405528843), 
                           CEAngle::Deg(12.5158780867456674), 
                           CESkyCoordType::ICRS),
                CESkyCoord(CEAngle::Deg(81.1700048918871886), 
                           CEAngle::Deg(103.2491992750974532), 
                           CESkyCoordType::OBSERVED),
                {3.99442023, 2.7334608, 1.07451899},
                {-0.00455544, 0.00587705, 0.00263009});
    
    return pass();
}